

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertModel
          (FBXConverter *this,Model *model,aiNode *parent,aiNode *root_node,
          aiMatrix4x4 *absolute_transform)

{
  undefined1 auVar1 [16];
  pointer this_00;
  bool bVar2;
  size_type sVar3;
  reference ppGVar4;
  string *__rhs;
  ulong __n;
  uint *__s;
  iterator __first1;
  iterator __last1;
  LineGeometry *local_2e8;
  LineGeometry *local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  format local_288;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_108;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_100;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices;
  LineGeometry *line;
  MeshGeometry *mesh;
  Geometry *geo;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_> *__range2;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_> *geos;
  aiMatrix4x4 *absolute_transform_local;
  aiNode *root_node_local;
  aiNode *parent_local;
  Model *model_local;
  FBXConverter *this_local;
  
  meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)Model::GetGeometry(model);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  sVar3 = std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
          ::size((vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                  *)meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,sVar3);
  this_00 = meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __end2 = std::
           vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>::
           begin((vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                  *)meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  geo = (Geometry *)
        std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>::
        end((vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_> *
            )this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
                                     *)&geo), bVar2) {
    ppGVar4 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
              ::operator*(&__end2);
    mesh = (MeshGeometry *)*ppGVar4;
    if (mesh == (MeshGeometry *)0x0) {
      local_2d8 = (LineGeometry *)0x0;
    }
    else {
      local_2d8 = (LineGeometry *)__dynamic_cast(mesh,&Geometry::typeinfo,&MeshGeometry::typeinfo,0)
      ;
    }
    line = local_2d8;
    if (mesh == (MeshGeometry *)0x0) {
      local_2e8 = (LineGeometry *)0x0;
    }
    else {
      local_2e8 = (LineGeometry *)__dynamic_cast(mesh,&Geometry::typeinfo,&LineGeometry::typeinfo,0)
      ;
    }
    indices = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8;
    if (line == (LineGeometry *)0x0) {
      if (local_2e8 == (LineGeometry *)0x0) {
        __rhs = FBX::Object::Name_abi_cxx11_((Object *)mesh);
        std::operator+(&local_2a8,"ignoring unrecognized geometry: ",__rhs);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_288,
                   &local_2a8);
        LogFunctions<Assimp::FBXImporter>::LogWarn(&local_288);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
      }
      else {
        ConvertLine(&local_f0,this,local_2e8,model,parent,root_node);
        local_d8 = &local_f0;
        local_f8._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(local_d8);
        local_100._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(local_d8);
        local_108 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
        local_110 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    std::
                    copy<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                              (local_f8,local_100,
                               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                )local_108);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_f0);
      }
    }
    else {
      ConvertMesh(&local_b0,this,(MeshGeometry *)line,model,parent,root_node,absolute_transform);
      local_98 = &local_b0;
      local_b8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(local_98);
      local_c0._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(local_98);
      local_c8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      indices_1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (local_b8,local_c0,
                             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )local_c8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b0);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
    ::operator++(&__end2);
  }
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  if (sVar3 != 0) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    __n = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      __n = 0xffffffffffffffff;
    }
    __s = (uint *)operator_new__(__n);
    memset(__s,0,__n);
    parent->mMeshes = __s;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    parent->mNumMeshes = (uint)sVar3;
    __first1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    __last1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    std::
    swap_ranges<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int*>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first1._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last1._M_current,parent->mMeshes);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  return;
}

Assistant:

void FBXConverter::ConvertModel(const Model &model, aiNode *parent, aiNode *root_node,
                                        const aiMatrix4x4 &absolute_transform)
        {
            const std::vector<const Geometry*>& geos = model.GetGeometry();

            std::vector<unsigned int> meshes;
            meshes.reserve(geos.size());

            for (const Geometry* geo : geos) {

                const MeshGeometry* const mesh = dynamic_cast<const MeshGeometry*>(geo);
                const LineGeometry* const line = dynamic_cast<const LineGeometry*>(geo);
                if (mesh) {
                    const std::vector<unsigned int>& indices = ConvertMesh(*mesh, model, parent, root_node,
                                                                           absolute_transform);
                    std::copy(indices.begin(), indices.end(), std::back_inserter(meshes));
                }
                else if (line) {
                    const std::vector<unsigned int>& indices = ConvertLine(*line, model, parent, root_node);
                    std::copy(indices.begin(), indices.end(), std::back_inserter(meshes));
                }
                else {
                    FBXImporter::LogWarn("ignoring unrecognized geometry: " + geo->Name());
                }
            }

            if (meshes.size()) {
                parent->mMeshes = new unsigned int[meshes.size()]();
                parent->mNumMeshes = static_cast<unsigned int>(meshes.size());

                std::swap_ranges(meshes.begin(), meshes.end(), parent->mMeshes);
            }
        }